

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

void __thiscall cfd::Psbt::Psbt(Psbt *this,Psbt *psbt)

{
  Psbt *in_RDI;
  Psbt *this_00;
  set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  *in_stack_ffffffffffffffa8;
  ByteData local_28;
  
  cfd::core::Psbt::GetData();
  cfd::core::Psbt::Psbt(in_RDI,&local_28);
  core::ByteData::~ByteData((ByteData *)0x3c2917);
  *(undefined ***)in_RDI = &PTR__Psbt_0057e368;
  this_00 = in_RDI + 0x50;
  std::
  set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>::
  set((set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
       *)0x3c2938);
  std::
  set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>::
  operator=((set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
             *)this_00,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

Psbt::Psbt(const Psbt& psbt) : cfd::core::Psbt(psbt.GetData()) {
  verify_ignore_map_ = psbt.verify_ignore_map_;
}